

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O0

void __thiscall Sandbox::printDependencies(Sandbox *this,ShaderType _type)

{
  size_type sVar1;
  const_reference pvVar2;
  ostream *poVar3;
  ulong local_28;
  size_t i_1;
  size_t i;
  ShaderType _type_local;
  Sandbox *this_local;
  
  if (_type == FRAGMENT) {
    for (i_1 = 0; sVar1 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::size(&this->m_frag_dependencies), i_1 < sVar1; i_1 = i_1 + 1) {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->m_frag_dependencies,i_1);
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)pvVar2);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    for (local_28 = 0;
        sVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->m_vert_dependencies), local_28 < sVar1; local_28 = local_28 + 1) {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->m_vert_dependencies,local_28);
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)pvVar2);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void Sandbox::printDependencies(ShaderType _type) const {
    if (_type == FRAGMENT)
        for (size_t i = 0; i < m_frag_dependencies.size(); i++)
            std::cout << m_frag_dependencies[i] << std::endl;
    
    else 
        for (size_t i = 0; i < m_vert_dependencies.size(); i++)
            std::cout << m_vert_dependencies[i] << std::endl;
}